

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

VP8StatusCode
ParseHeadersInternal
          (uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha,int *has_animation,
          int *format,WebPHeaderStructure *headers)

{
  uint uVar1;
  uint32_t total_size;
  uint uVar2;
  int iVar3;
  uint8_t *buf;
  int *data_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong size;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint local_88;
  int local_84;
  ulong local_80;
  uint local_74;
  ulong local_70;
  int *local_68;
  uint *local_60;
  ulong local_58;
  uint local_4c;
  ulong local_48;
  int *local_40;
  uint *local_38;
  
  if (headers == (WebPHeaderStructure *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = headers->have_all_data != 0;
  }
  if (data_size < 0xc || data == (uint8_t *)0x0) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  bVar9 = *(int *)data == 0x46464952;
  if (bVar9) {
    if (*(int *)(data + 8) != 0x50424557) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    local_80 = (ulong)*(uint *)(data + 4);
    if (*(uint *)(data + 4) + 9 < 0x15) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    size = data_size - 0xc;
    if (size < 8) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    if ((bool)(data_size - 8 < local_80 & bVar8)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    data_00 = (int *)(data + 0xc);
  }
  else {
    local_80 = 0;
    data_00 = (int *)data;
    size = data_size;
  }
  local_58 = 0;
  iVar3 = *data_00;
  if (iVar3 == 0x58385056) {
    if (data_00[1] != 10) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (size < 0x12) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    local_58 = (ulong)((uint)*(ushort *)(data_00 + 3) +
                       (uint)*(byte *)((long)data_00 + 0xe) * 0x10000 + 1);
    local_74 = (uint)*(byte *)((long)data_00 + 0x11) * 0x10000 +
               (uint)*(ushort *)((long)data_00 + 0xf) + 1;
    if ((int)(local_58 * local_74 >> 0x20) != 0) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    uVar4 = data_00[2];
    data_00 = (int *)((long)data_00 + 0x12);
    size = size - 0x12;
  }
  else {
    local_74 = 0;
    uVar4 = 0;
  }
  local_4c = (uint)(iVar3 != 0x58385056);
  bVar10 = local_4c == 0;
  if (!bVar9 && bVar10) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }
  if (has_alpha != (int *)0x0) {
    *has_alpha = uVar4 >> 4 & 1;
  }
  uVar4 = uVar4 & 2;
  if (has_animation != (int *)0x0) {
    *has_animation = uVar4 >> 1;
  }
  local_70 = CONCAT71(local_70._1_7_,bVar10);
  if (format != (int *)0x0) {
    *format = 0;
  }
  local_84 = (int)local_58;
  local_88 = local_74;
  local_40 = width;
  local_38 = (uint *)height;
  if ((headers == (WebPHeaderStructure *)0x0) && (uVar4 != 0 && bVar10)) {
    local_68 = (int *)0x0;
    goto LAB_0010a5a0;
  }
  if (size < 4) {
    local_68 = (int *)0x0;
  }
  else if ((bVar9 && bVar10) || ((!bVar9 && !bVar10 && (*data_00 == 0x48504c41)))) {
    uVar2 = 0x16;
    local_68 = (int *)0x0;
    local_48 = 0;
    while (7 < size) {
      uVar1 = data_00[1];
      if (0xfffffff6 < (ulong)uVar1) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      uVar5 = uVar1 + 9 & 0xfffffffe;
      uVar7 = (ulong)uVar5;
      uVar2 = uVar2 + uVar5;
      if ((bVar9) && ((uint)local_80 < uVar2)) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if ((*data_00 == 0x20385056) || (*data_00 == 0x4c385056)) goto LAB_0010a46b;
      bVar10 = size < uVar7;
      size = size - uVar7;
      if (bVar10) break;
      if (*data_00 == 0x48504c41) {
        local_48 = (ulong)uVar1;
        local_68 = data_00 + 2;
      }
      data_00 = (int *)((long)data_00 + uVar7);
    }
  }
  else {
    local_68 = (int *)0x0;
    local_48 = 0;
LAB_0010a46b:
    if (7 < size) {
      if (*data_00 == 0x20385056 || *data_00 == 0x4c385056) {
        uVar6 = (ulong)(uint)data_00[1];
        if ((0xb < local_80) && (local_80 - 0xc < uVar6)) {
          return VP8_STATUS_BITSTREAM_ERROR;
        }
        uVar7 = size - 8;
        if ((bool)(bVar8 & uVar7 < uVar6)) goto LAB_0010a58b;
        uVar2 = (uint)(*data_00 == 0x4c385056);
        data_00 = data_00 + 2;
        size = uVar6;
      }
      else {
        local_60 = (uint *)has_alpha;
        uVar2 = VP8LCheckSignature((uint8_t *)data_00,size);
        has_alpha = (int *)local_60;
        uVar7 = size;
      }
      if (0xfffffff6 < size) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if ((format != (int *)0x0) && (uVar4 == 0)) {
        *format = 2 - (uint)(uVar2 == 0);
      }
      local_60 = (uint *)has_alpha;
      if (uVar2 == 0) {
        if (9 < uVar7) {
          local_70 = size;
          iVar3 = VP8GetInfo((uint8_t *)data_00,uVar7,size,&local_84,(int *)&local_88);
          goto LAB_0010a614;
        }
      }
      else if (4 < uVar7) {
        local_70 = size;
        iVar3 = VP8LGetInfo((uint8_t *)data_00,uVar7,&local_84,(int *)&local_88,has_alpha);
LAB_0010a614:
        if (iVar3 == 0) {
          return VP8_STATUS_BITSTREAM_ERROR;
        }
        if (local_4c == 0) {
          if ((int)local_58 != local_84) {
            return VP8_STATUS_BITSTREAM_ERROR;
          }
          if (local_74 != local_88) {
            return VP8_STATUS_BITSTREAM_ERROR;
          }
        }
        has_alpha = (int *)local_60;
        if (headers != (WebPHeaderStructure *)0x0) {
          headers->data = data;
          headers->data_size = data_size;
          *(undefined8 *)&headers->have_all_data = 0;
          headers->alpha_data = (uint8_t *)local_68;
          headers->alpha_data_size = local_48;
          headers->compressed_size = local_70;
          headers->riff_size = local_80;
          headers->is_lossless = uVar2;
          *(undefined4 *)&headers->field_0x44 = 0;
          headers->offset = (long)data_00 - (long)data;
        }
        goto LAB_0010a5a0;
      }
    }
  }
LAB_0010a58b:
  if ((char)local_70 != '\x01' || headers != (WebPHeaderStructure *)0x0) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
LAB_0010a5a0:
  if ((uint *)has_alpha != (uint *)0x0) {
    *has_alpha = *has_alpha | (uint)(local_68 != (int *)0x0);
  }
  if (local_40 != (int *)0x0) {
    *local_40 = local_84;
  }
  if (local_38 != (uint *)0x0) {
    *local_38 = local_88;
    return VP8_STATUS_OK;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseHeadersInternal(const uint8_t* data,
                                          size_t data_size,
                                          int* const width,
                                          int* const height,
                                          int* const has_alpha,
                                          int* const has_animation,
                                          int* const format,
                                          WebPHeaderStructure* const headers) {
  int canvas_width = 0;
  int canvas_height = 0;
  int image_width = 0;
  int image_height = 0;
  int found_riff = 0;
  int found_vp8x = 0;
  int animation_present = 0;
  const int have_all_data = (headers != NULL) ? headers->have_all_data : 0;

  VP8StatusCode status;
  WebPHeaderStructure hdrs;

  if (data == NULL || data_size < RIFF_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  memset(&hdrs, 0, sizeof(hdrs));
  hdrs.data = data;
  hdrs.data_size = data_size;

  // Skip over RIFF header.
  status = ParseRIFF(&data, &data_size, have_all_data, &hdrs.riff_size);
  if (status != VP8_STATUS_OK) {
    return status;   // Wrong RIFF header / insufficient data.
  }
  found_riff = (hdrs.riff_size > 0);

  // Skip over VP8X.
  {
    uint32_t flags = 0;
    status = ParseVP8X(&data, &data_size, &found_vp8x,
                       &canvas_width, &canvas_height, &flags);
    if (status != VP8_STATUS_OK) {
      return status;  // Wrong VP8X / insufficient data.
    }
    animation_present = !!(flags & ANIMATION_FLAG);
    if (!found_riff && found_vp8x) {
      // Note: This restriction may be removed in the future, if it becomes
      // necessary to send VP8X chunk to the decoder.
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (has_alpha != NULL) *has_alpha = !!(flags & ALPHA_FLAG);
    if (has_animation != NULL) *has_animation = animation_present;
    if (format != NULL) *format = 0;   // default = undefined

    image_width = canvas_width;
    image_height = canvas_height;
    if (found_vp8x && animation_present && headers == NULL) {
      status = VP8_STATUS_OK;
      goto ReturnWidthHeight;  // Just return features from VP8X header.
    }
  }

  if (data_size < TAG_SIZE) {
    status = VP8_STATUS_NOT_ENOUGH_DATA;
    goto ReturnWidthHeight;
  }

  // Skip over optional chunks if data started with "RIFF + VP8X" or "ALPH".
  if ((found_riff && found_vp8x) ||
      (!found_riff && !found_vp8x && !memcmp(data, "ALPH", TAG_SIZE))) {
    status = ParseOptionalChunks(&data, &data_size, hdrs.riff_size,
                                 &hdrs.alpha_data, &hdrs.alpha_data_size);
    if (status != VP8_STATUS_OK) {
      goto ReturnWidthHeight;  // Invalid chunk size / insufficient data.
    }
  }

  // Skip over VP8/VP8L header.
  status = ParseVP8Header(&data, &data_size, have_all_data, hdrs.riff_size,
                          &hdrs.compressed_size, &hdrs.is_lossless);
  if (status != VP8_STATUS_OK) {
    goto ReturnWidthHeight;  // Wrong VP8/VP8L chunk-header / insufficient data.
  }
  if (hdrs.compressed_size > MAX_CHUNK_PAYLOAD) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }

  if (format != NULL && !animation_present) {
    *format = hdrs.is_lossless ? 2 : 1;
  }

  if (!hdrs.is_lossless) {
    if (data_size < VP8_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8 data.
    if (!VP8GetInfo(data, data_size, (uint32_t)hdrs.compressed_size,
                    &image_width, &image_height)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  } else {
    if (data_size < VP8L_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8L data.
    if (!VP8LGetInfo(data, data_size, &image_width, &image_height, has_alpha)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  // Validates image size coherency.
  if (found_vp8x) {
    if (canvas_width != image_width || canvas_height != image_height) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  if (headers != NULL) {
    *headers = hdrs;
    headers->offset = data - headers->data;
    assert((uint64_t)(data - headers->data) < MAX_CHUNK_PAYLOAD);
    assert(headers->offset == headers->data_size - data_size);
  }
 ReturnWidthHeight:
  if (status == VP8_STATUS_OK ||
      (status == VP8_STATUS_NOT_ENOUGH_DATA && found_vp8x && headers == NULL)) {
    if (has_alpha != NULL) {
      // If the data did not contain a VP8X/VP8L chunk the only definitive way
      // to set this is by looking for alpha data (from an ALPH chunk).
      *has_alpha |= (hdrs.alpha_data != NULL);
    }
    if (width != NULL) *width = image_width;
    if (height != NULL) *height = image_height;
    return VP8_STATUS_OK;
  } else {
    return status;
  }
}